

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Impl::makeDep
          (Impl *this,Binding *result,Reader type,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  undefined8 *puVar1;
  short sVar2;
  size_t sVar3;
  Scope *pSVar4;
  undefined8 uVar5;
  anon_union_8_2_eba6ea51_for_Binding_4 aVar6;
  Reader type_00;
  Reader brand;
  uint16_t uVar7;
  RawBrandedSchema *pRVar8;
  Which whichType;
  uint64_t typeId;
  long lVar9;
  ushort uVar10;
  Which expectedKind;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings_00;
  bool bVar11;
  PointerReader local_178;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_150;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_138;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_120;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_108;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (type._reader.dataSize < 0x10) {
    uVar10 = 0;
LAB_0037383a:
    result->which = (uint8_t)uVar10;
    return;
  }
  uVar10 = *type._reader.data;
  if (uVar10 < 0xe) goto LAB_0037383a;
  local_178.pointer = type._reader.pointers;
  switch(uVar10) {
  case 0xe:
    bVar11 = type._reader.pointerCount == 0;
    if (bVar11) {
      local_178.pointer = (WirePointer *)0x0;
    }
    local_178.nestingLimit = 0x7fffffff;
    if (!bVar11) {
      local_178.nestingLimit = type._reader.nestingLimit;
    }
    local_178.segment._0_4_ = 0;
    local_178.segment._4_4_ = 0;
    local_178.capTable._0_4_ = 0;
    local_178.capTable._4_4_ = 0;
    if (!bVar11) {
      local_178.segment._0_4_ = type._reader.segment._0_4_;
      local_178.segment._4_4_ = type._reader.segment._4_4_;
      local_178.capTable._0_4_ = type._reader.capTable._0_4_;
      local_178.capTable._4_4_ = type._reader.capTable._4_4_;
    }
    capnp::_::PointerReader::getStruct(&local_f0,&local_178,(word *)0x0);
    local_150.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_150.ptr.isSet == true) {
      local_150.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_150.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    type_00._reader.capTable = local_f0.capTable;
    type_00._reader.segment = local_f0.segment;
    type_00._reader.data = local_f0.data;
    type_00._reader.pointers = local_f0.pointers;
    type_00._reader.dataSize = local_f0.dataSize;
    type_00._reader.pointerCount = local_f0.pointerCount;
    type_00._reader._38_2_ = local_f0._38_2_;
    type_00._reader.nestingLimit = local_f0.nestingLimit;
    type_00._reader._44_4_ = local_f0._44_4_;
    makeDep(this,result,type_00,scopeName,&local_150);
    result->listDepth = result->listDepth + 1;
    return;
  case 0xf:
    if (type._reader.dataSize < 0x80) {
      typeId = 0;
    }
    else {
      typeId = *(uint64_t *)((long)type._reader.data + 8);
    }
    local_178.segment._0_4_ = 0;
    local_178.segment._4_4_ = 0;
    local_178.capTable._0_4_ = 0;
    local_178.capTable._4_4_ = 0;
    if (type._reader.pointerCount == 0) {
      local_178.pointer = (WirePointer *)0x0;
    }
    local_178.nestingLimit = 0x7fffffff;
    if (type._reader.pointerCount != 0) {
      local_178.segment._0_4_ = type._reader.segment._0_4_;
      local_178.segment._4_4_ = type._reader.segment._4_4_;
      local_178.capTable._0_4_ = type._reader.capTable._0_4_;
      local_178.capTable._4_4_ = type._reader.capTable._4_4_;
      local_178.nestingLimit = type._reader.nestingLimit;
    }
    capnp::_::PointerReader::getStruct(&local_90,&local_178,(word *)0x0);
    local_120.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_120.ptr.isSet == true) {
      local_120.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_120.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    brandBindings_00 = &local_120;
    whichType = ENUM;
    expectedKind = ENUM;
    local_c0.segment = local_90.segment;
    local_c0.capTable = local_90.capTable;
    local_c0.data = local_90.data;
    local_c0.pointers = local_90.pointers;
    local_c0._32_8_ = local_90._32_8_;
    local_c0._40_8_ = local_90._40_8_;
    break;
  case 0x10:
    if (type._reader.dataSize < 0x80) {
      typeId = 0;
    }
    else {
      typeId = *(uint64_t *)((long)type._reader.data + 8);
    }
    local_178.segment._0_4_ = 0;
    local_178.segment._4_4_ = 0;
    local_178.capTable._0_4_ = 0;
    local_178.capTable._4_4_ = 0;
    if (type._reader.pointerCount == 0) {
      local_178.pointer = (WirePointer *)0x0;
    }
    local_178.nestingLimit = 0x7fffffff;
    if (type._reader.pointerCount != 0) {
      local_178.segment._0_4_ = type._reader.segment._0_4_;
      local_178.segment._4_4_ = type._reader.segment._4_4_;
      local_178.capTable._0_4_ = type._reader.capTable._0_4_;
      local_178.capTable._4_4_ = type._reader.capTable._4_4_;
      local_178.nestingLimit = type._reader.nestingLimit;
    }
    capnp::_::PointerReader::getStruct(&local_60,&local_178,(word *)0x0);
    local_108.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_108.ptr.isSet == true) {
      local_108.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_108.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    brandBindings_00 = &local_108;
    whichType = STRUCT;
    expectedKind = STRUCT;
    local_c0.segment = local_60.segment;
    local_c0.capTable = local_60.capTable;
    local_c0.data = local_60.data;
    local_c0.pointers = local_60.pointers;
    local_c0._32_8_ = local_60._32_8_;
    local_c0._40_8_ = local_60._40_8_;
    break;
  case 0x11:
    if (type._reader.dataSize < 0x80) {
      typeId = 0;
    }
    else {
      typeId = *(uint64_t *)((long)type._reader.data + 8);
    }
    local_178.segment._0_4_ = 0;
    local_178.segment._4_4_ = 0;
    local_178.capTable._0_4_ = 0;
    local_178.capTable._4_4_ = 0;
    if (type._reader.pointerCount == 0) {
      local_178.pointer = (WirePointer *)0x0;
    }
    local_178.nestingLimit = 0x7fffffff;
    if (type._reader.pointerCount != 0) {
      local_178.segment._0_4_ = type._reader.segment._0_4_;
      local_178.segment._4_4_ = type._reader.segment._4_4_;
      local_178.capTable._0_4_ = type._reader.capTable._0_4_;
      local_178.capTable._4_4_ = type._reader.capTable._4_4_;
      local_178.nestingLimit = type._reader.nestingLimit;
    }
    capnp::_::PointerReader::getStruct(&local_c0,&local_178,(word *)0x0);
    local_138.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_138.ptr.isSet == true) {
      local_138.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_138.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    brandBindings_00 = &local_138;
    whichType = INTERFACE;
    expectedKind = INTERFACE;
    break;
  case 0x12:
    result->which = '\x12';
    if (type._reader.dataSize < 0x50) {
      return;
    }
    sVar2 = *(short *)((long)type._reader.data + 8);
    if (sVar2 == 0) {
      return;
    }
    if (sVar2 == 2) {
      result->isImplicitParameter = true;
      if (type._reader.dataSize < 0x60) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint16_t *)((long)type._reader.data + 10);
      }
      result->paramIndex = uVar7;
      return;
    }
    if (sVar2 != 1) goto switchD_0037386f_default;
    if (type._reader.dataSize < 0xc0) {
      pRVar8 = (RawBrandedSchema *)0x0;
      uVar10 = 0;
      if (type._reader.dataSize < 0x60) goto LAB_00373bf3;
    }
    else {
      pRVar8 = *(RawBrandedSchema **)((long)type._reader.data + 0x10);
    }
    uVar10 = *(ushort *)((long)type._reader.data + 10);
LAB_00373bf3:
    if ((brandBindings->ptr).isSet == true) {
      sVar3 = (brandBindings->ptr).field_1.value.size_;
      if (sVar3 == 0) {
        return;
      }
      pSVar4 = (brandBindings->ptr).field_1.value.ptr;
      lVar9 = 0;
      while (*(RawBrandedSchema **)((long)&pSVar4->typeId + lVar9) != pRVar8) {
        lVar9 = lVar9 + 0x18;
        if (sVar3 * 0x18 == lVar9) {
          return;
        }
      }
      if ((&pSVar4->isUnbound)[lVar9] != true) {
        if (*(uint *)((long)&pSVar4->bindingCount + lVar9) <= (uint)uVar10) {
          return;
        }
        puVar1 = (undefined8 *)(*(long *)((long)&pSVar4->bindings + lVar9) + (ulong)uVar10 * 0x10);
        uVar5 = *puVar1;
        aVar6 = *(anon_union_8_2_eba6ea51_for_Binding_4 *)(puVar1 + 1);
        result->which = (char)uVar5;
        result->isImplicitParameter = (bool)(char)((ulong)uVar5 >> 8);
        result->listDepth = (short)((ulong)uVar5 >> 0x10);
        result->paramIndex = (short)((ulong)uVar5 >> 0x20);
        *(short *)&result->field_0x6 = (short)((ulong)uVar5 >> 0x30);
        result->field_4 = aVar6;
        return;
      }
    }
    (result->field_4).schema = pRVar8;
    result->paramIndex = uVar10;
    return;
  default:
switchD_0037386f_default:
    kj::_::unreachable();
  }
  brand._reader.capTable = local_c0.capTable;
  brand._reader.segment = local_c0.segment;
  brand._reader.data = local_c0.data;
  brand._reader.pointers = local_c0.pointers;
  brand._reader.dataSize = local_c0.dataSize;
  brand._reader.pointerCount = local_c0.pointerCount;
  brand._reader._38_2_ = local_c0._38_2_;
  brand._reader.nestingLimit = local_c0.nestingLimit;
  brand._reader._44_4_ = local_c0._44_4_;
  makeDep(this,result,typeId,whichType,expectedKind,brand,scopeName,brandBindings_00);
  return;
}

Assistant:

void SchemaLoader::Impl::makeDep(_::RawBrandedSchema::Binding& result,
    schema::Type::Reader type, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  switch (type.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      result.which = static_cast<uint8_t>(type.which());
      return;

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      makeDep(result, structType.getTypeId(), schema::Type::STRUCT, schema::Node::STRUCT,
              structType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      makeDep(result, enumType.getTypeId(), schema::Type::ENUM, schema::Node::ENUM,
              enumType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      makeDep(result, interfaceType.getTypeId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              interfaceType.getBrand(), scopeName, brandBindings);
      return;
    }

    case schema::Type::LIST: {
      makeDep(result, type.getList().getElementType(), scopeName, brandBindings);
      ++result.listDepth;
      return;
    }

    case schema::Type::ANY_POINTER: {
      result.which = static_cast<uint8_t>(schema::Type::ANY_POINTER);
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          uint64_t id = param.getScopeId();
          uint16_t index = param.getParameterIndex();

          KJ_IF_SOME(b, brandBindings) {
            // TODO(perf): We could binary search here, but... bleh.
            for (auto& scope: b) {
              if (scope.typeId == id) {
                if (scope.isUnbound) {
                  // Unbound brand parameter.
                  result.scopeId = id;
                  result.paramIndex = index;
                  return;
                } else if (index >= scope.bindingCount) {
                  // Binding index out-of-range. Treat as AnyPointer. This is important to allow
                  // new type parameters to be added to existing types without breaking dependent
                  // schemas.
                  return;
                } else {
                  result = scope.bindings[index];
                  return;
                }
              }
            }
            return;
          } else {
            // Unbound brand parameter.
            result.scopeId = id;
            result.paramIndex = index;
            return;
          }
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          result.isImplicitParameter = true;
          result.paramIndex = anyPointer.getImplicitMethodParameter().getParameterIndex();
          return;
      }
      KJ_UNREACHABLE;
    }
  }